

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInstancedRenderingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::InstancedRenderingCase::InstancedRenderingCase
          (InstancedRenderingCase *this,Context *context,char *name,char *description,
          DrawFunction function,InstancingType instancingType,DataType rgbAttrType,int numInstances)

{
  InstancingType instancingType_local;
  DrawFunction function_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  InstancedRenderingCase *this_local;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InstancedRenderingCase_032a19a8;
  this->m_function = function;
  this->m_instancingType = instancingType;
  this->m_rgbAttrType = rgbAttrType;
  this->m_numInstances = numInstances;
  std::vector<float,_std::allocator<float>_>::vector(&this->m_gridVertexPositions);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_gridIndices);
  std::vector<float,_std::allocator<float>_>::vector(&this->m_instanceOffsets);
  std::
  vector<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
  ::vector(&this->m_instanceColorR);
  std::
  vector<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
  ::vector(&this->m_instanceColorG);
  std::
  vector<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
  ::vector(&this->m_instanceColorB);
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

InstancedRenderingCase::InstancedRenderingCase (Context& context, const char* name, const char* description, DrawFunction function, InstancingType instancingType, glu::DataType rgbAttrType, int numInstances)
	: TestCase			(context, name, description)
	, m_function		(function)
	, m_instancingType	(instancingType)
	, m_rgbAttrType		(rgbAttrType)
	, m_numInstances	(numInstances)
	, m_program			(DE_NULL)
{
}